

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fft.hpp
# Opt level: O0

void __thiscall
re::fft::real_fft<float,_4096L,_(re::fft::direction)0>::real_fft
          (real_fft<float,_4096L,_(re::fft::direction)0> *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float local_28;
  float local_24;
  _ComplexT local_20;
  uint local_18;
  undefined4 local_14;
  uint i;
  float step;
  real_fft<float,_4096L,_(re::fft::direction)0> *this_local;
  
  _i = this;
  fft<float,_2048L,_(re::fft::direction)0>::fft(&this->fft_);
  std::array<std::complex<float>,_2048UL>::array(&this->twiddles);
  local_14 = 0x3ac90fdb;
  local_18 = 0;
  while( true ) {
    uVar1 = (ulong)local_18;
    sVar2 = ::std::size<std::array<std::complex<float>,2048ul>>(&this->twiddles);
    if (sVar2 <= uVar1) break;
    local_24 = 1.0;
    local_28 = (float)((ulong)local_18 + 0x400) * 0.0015339808;
    std::polar<float>(&local_24,&local_28);
    local_20 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    pvVar3 = std::array<std::complex<float>,_2048UL>::operator[](&this->twiddles,(ulong)local_18);
    pvVar3->_M_value = local_20;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

real_fft() noexcept
    {
        auto const step = (is_inverse(Direction) ? -2 : 2) * pi<real_t> / N;
        for (auto i = 0u; i < std::size(twiddles); ++i) {
            twiddles[i] = std::polar(real_t{1}, (i + N / 4) * step);
        }
    }